

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O2

ssize_t __thiscall higan::FileForRead::ReadFileToBuffer(FileForRead *this,Buffer *buffer)

{
  ssize_t sVar1;
  
  if ((buffer != (Buffer *)0x0) && (this->file_status_ == OPEN_SUCCESS)) {
    sVar1 = Buffer::ReadFromFd(buffer,this->read_fd_);
    return sVar1;
  }
  return -1;
}

Assistant:

ssize_t FileForRead::ReadFileToBuffer(Buffer* buffer)
{
	if (!buffer)
	{
		return -1;
	}

	size_t result = -1;
	if (file_status_ == FileStatus::OPEN_SUCCESS)
	{
		result = buffer->ReadFromFd(read_fd_);
	}
	else
	{
		result = -1;
	}

	return result;
}